

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::TypeSpecializeStElem(GlobOpt *this,Instr **pInstr,Value *src1Val,Value **pDstVal)

{
  Opnd *pOVar1;
  Sym *pSVar2;
  IndirOpnd *indirOpnd;
  code *pcVar3;
  Instr **pInstr_00;
  OpndKind OVar4;
  bool bVar5;
  bool bVar6;
  ObjectType OVar7;
  uint uVar8;
  uint uVar9;
  BailOutKind BVar10;
  undefined4 *puVar11;
  JITTimeFunctionBody *pJVar12;
  FunctionJITTimeInfo *pFVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  ValueType *this_00;
  Instr *this_01;
  char16_t *pcVar17;
  BailOutKind BVar18;
  int local_1b8 [2];
  char baseValueTypeStr [256];
  char16 debugStringBuffer [42];
  int local_5c [2];
  int32 src1IntConstantValue;
  char16_t *local_50;
  Sym *local_48;
  Instr **local_40;
  BailOutKind local_38;
  IRType local_33;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType baseValueType;
  
  pOVar1 = (*pInstr)->m_dst;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar5) goto LAB_00461177;
    *puVar11 = 0;
  }
  local_32[0] = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(pOVar1[1]._vptr_Opnd + 1);
  bVar5 = IR::Instr::DoStackArgsOpt(*pInstr);
  if ((((bVar5) ||
       ((bVar5 = DoTypedArrayTypeSpec(this->func), !bVar5 &&
        (bVar5 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), bVar5)))
       ) || ((bVar5 = DoNativeArrayTypeSpec(this->func), !bVar5 &&
             (bVar5 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), bVar5))))
     || ((bVar5 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), !bVar5
         && (bVar5 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), !bVar5)))) {
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar8,uVar9);
    if (bVar5) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(
                   L"Didn\'t type specialize array access, because typed array type specialization is disabled, or base is not an optimized typed array.\n"
                   );
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypedArrayTypeSpecPhase,uVar8,uVar9);
    if (!bVar5) {
      return false;
    }
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    bVar5 = IR::Instr::DoStackArgsOpt(*pInstr);
    pcVar17 = 
    L"typed array type specialization is disabled, or base is not an optimized typed array";
    if (bVar5) {
      pcVar17 = L"instruction uses the arguments object";
    }
    Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because %s.\n"
                  ,pcVar14,pcVar15,pcVar16,(char (*) [256])local_1b8,pcVar17);
    goto LAB_00460373;
  }
  OVar4 = IR::Opnd::GetKind((*pInstr)->m_src1);
  if ((OVar4 != OpndKindReg) &&
     ((src1Val == (Value *)0x0 ||
      (bVar5 = ValueInfo::HasIntConstantValue(src1Val->valueInfo,false), !bVar5)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2ae9,
                       "(instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue()))"
                       ,
                       "instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue())"
                      );
    if (!bVar5) goto LAB_00461177;
    *puVar11 = 0;
  }
  OVar4 = IR::Opnd::GetKind((*pInstr)->m_src1);
  bVar5 = true;
  local_40 = pInstr;
  if (OVar4 == OpndKindReg) {
    pOVar1 = (*pInstr)->m_src1;
    OVar4 = IR::Opnd::GetKind(pOVar1);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar6) goto LAB_00461177;
      *puVar11 = 0;
    }
    pSVar2 = (Sym *)pOVar1[1]._vptr_Opnd;
    if (pSVar2 == (Sym *)0x0) goto LAB_0046053b;
    bVar5 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    bVar6 = GlobOptBlockData::IsInt32TypeSpecialized(&this->currentBlock->globOptData,pSVar2);
    if (bVar5) {
      if (bVar6) goto LAB_00460703;
      if (src1Val == (Value *)0x0) {
        bVar5 = GlobOptBlockData::IsFloat64TypeSpecialized(&this->currentBlock->globOptData,pSVar2);
LAB_00460afa:
        if (bVar5 == false) {
          return false;
        }
      }
      else {
        this_00 = &src1Val->valueInfo->super_ValueType;
        if ((this->field_0xf5 & 2) == 0) {
          bVar5 = ValueType::IsInt(this_00);
        }
        else {
          bVar5 = ValueType::IsLikelyInt(this_00);
        }
        if (bVar5 != false) goto LAB_00460703;
        bVar5 = GlobOptBlockData::IsFloat64TypeSpecialized(&this->currentBlock->globOptData,pSVar2);
        if (!bVar5) {
          bVar5 = ValueType::IsLikelyNumber(&src1Val->valueInfo->super_ValueType);
          goto LAB_00460afa;
        }
      }
      local_48 = pSVar2;
      bVar6 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
      bVar5 = false;
      if (bVar6) {
        return false;
      }
      goto LAB_00460709;
    }
    if ((bVar6) ||
       (bVar5 = GlobOptBlockData::IsFloat64TypeSpecialized(&this->currentBlock->globOptData,pSVar2),
       bVar5)) {
LAB_00460703:
      bVar5 = false;
      local_48 = pSVar2;
      goto LAB_00460709;
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar8,uVar9);
    if (bVar5) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Didn\'t specialize array access, because src is not type specialized.\n");
      IR::Instr::Dump(*local_40);
      Output::Flush();
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypedArrayTypeSpecPhase,uVar8,uVar9);
    if (!bVar5) {
      return false;
    }
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar16 = Js::OpCodeUtil::GetOpCodeName((*local_40)->m_opcode);
    pcVar17 = 
    L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because src is not specialized.\n"
    ;
    goto LAB_00460dc9;
  }
LAB_0046053b:
  local_48 = (Sym *)0x0;
LAB_00460709:
  bVar6 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_32[0].field_0);
  if (((src1Val != (Value *)0x0 && bVar6) &&
      (bVar6 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,local_5c,false), bVar6)) &&
     (local_5c[0] == -0x7fffe)) {
    return false;
  }
  OVar4 = IR::Opnd::GetKind((*local_40)->m_dst);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2b2a,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar6) goto LAB_00461177;
    *puVar11 = 0;
  }
  indirOpnd = (IndirOpnd *)(*local_40)->m_dst;
  OVar4 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar6) goto LAB_00461177;
    *puVar11 = 0;
  }
  ToVarUses(this,*local_40,(Opnd *)indirOpnd,true,(Value *)0x0);
  bVar6 = ShouldExpectConventionalArrayIndexValue(this,indirOpnd);
  if (!bVar6) {
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar8,uVar9);
    if (bVar5) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(
                   L"Didn\'t specialize array access, because index is negative or likely not int.\n"
                   );
      IR::Instr::Dump(*local_40);
      Output::Flush();
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypedArrayTypeSpecPhase,uVar8,uVar9);
    if (!bVar5) {
      return false;
    }
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar16 = Js::OpCodeUtil::GetOpCodeName((*local_40)->m_opcode);
    pcVar17 = 
    L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because index is negative or likely not int.\n"
    ;
    goto LAB_00460dc9;
  }
  OVar7 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
  pSVar2 = local_48;
  BVar18 = BailOutConventionalTypedArrayAccessOnly;
  bVar6 = true;
  switch(OVar7) {
  case Uint8ClampedArray:
  case Uint8ClampedVirtualArray:
  case Uint8ClampedMixedArray:
    local_38 = BailOutConventionalTypedArrayAccessOnly;
    if ((!bVar5) &&
       (bVar5 = GlobOptBlockData::IsInt32TypeSpecialized(&this->currentBlock->globOptData,local_48),
       !bVar5)) {
      bVar5 = GlobOptBlockData::IsFloat64TypeSpecialized(&this->currentBlock->globOptData,pSVar2);
      if (bVar5) {
        local_38 = BailOutConventionalTypedArrayAccessOnly;
        local_50 = L"float64";
        stack0xffffffffffffffa8 = 2;
        local_33 = TyFloat64;
        bVar6 = true;
        break;
      }
      goto LAB_00460c5d;
    }
    local_50 = L"int32";
    local_33 = TyInt32;
    stack0xffffffffffffffa8 = 1;
    bVar6 = false;
    break;
  case Uint32Array:
  case Uint32VirtualArray:
  case Uint32MixedArray:
    local_50 = L"int32";
    stack0xffffffffffffffa8 = 1;
    local_33 = TyInt32;
    bVar6 = true;
    local_38 = BailOutConventionalTypedArrayAccessOnly;
    if ((bVar5) ||
       (bVar5 = GlobOptBlockData::IsInt32TypeSpecialized(&this->currentBlock->globOptData,local_48),
       bVar5)) break;
    bVar5 = GlobOptBlockData::IsFloat64TypeSpecialized(&this->currentBlock->globOptData,pSVar2);
    if (!bVar5) goto LAB_00460c5d;
    local_38 = BailOutConventionalTypedArrayAccessOnly;
    BVar18 = local_38;
    bVar6 = true;
    goto LAB_00460e00;
  case Float32Array:
  case Float64Array:
  case Float32VirtualArray:
  case Float64VirtualArray:
  case Float32MixedArray:
  case Float64MixedArray:
switchD_00460870_caseD_c:
    if ((this->field_0xf5 & 0x20) == 0) goto LAB_00460c5d;
LAB_00460e00:
    local_38 = BVar18;
    local_50 = L"float64";
    stack0xffffffffffffffa8 = 2;
    local_33 = TyFloat64;
    break;
  default:
    bVar5 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2b8f,"(baseValueType.IsLikelyNativeArray())",
                         "baseValueType.IsLikelyNativeArray()");
      if (!bVar5) goto LAB_00461177;
      *puVar11 = 0;
    }
    bVar5 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    if (!bVar5) {
      bVar5 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
      BVar18 = BailOutConventionalNativeArrayAccessOnly;
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2b96,"(baseValueType.HasFloatElements())",
                           "baseValueType.HasFloatElements()");
        if (!bVar5) goto LAB_00461177;
        *puVar11 = 0;
      }
      bVar6 = false;
      goto switchD_00460870_caseD_c;
    }
    BVar18 = BailOutConventionalNativeArrayAccessOnly;
    bVar6 = false;
  case Int8Array:
  case Uint8Array:
  case Int16Array:
  case Uint16Array:
  case Int32Array:
  case Int8VirtualArray:
  case Uint8VirtualArray:
  case Int16VirtualArray:
  case Uint16VirtualArray:
  case Int32VirtualArray:
  case Int8MixedArray:
  case Uint8MixedArray:
  case Int16MixedArray:
  case Uint16MixedArray:
  case Int32MixedArray:
    if ((this->field_0xf5 & 0x22) == 0) {
LAB_00460c5d:
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar8,uVar9);
      if (bVar5) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(
                     L"Didn\'t specialize array access, because the source was not already specialized.\n"
                     );
        IR::Instr::Dump(*local_40);
        Output::Flush();
      }
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypedArrayTypeSpecPhase,uVar8,uVar9);
      if (!bVar5) {
        return false;
      }
      ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                          (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
      pcVar16 = Js::OpCodeUtil::GetOpCodeName((*local_40)->m_opcode);
      pcVar17 = 
      L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because of array type.\n"
      ;
LAB_00460dc9:
      Output::Print(pcVar17,pcVar14,pcVar15,pcVar16,local_1b8);
LAB_00460373:
      Output::Flush();
      return false;
    }
    local_50 = L"int32";
    stack0xffffffffffffffa8 = 1;
    local_33 = TyInt32;
    local_38 = BVar18;
  }
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
  pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar8,uVar9);
  if (bVar5) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized array access.\n");
    IR::Instr::Dump(*local_40);
    Output::Flush();
  }
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
  pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypedArrayTypeSpecPhase,uVar8,uVar9);
  if (bVar5) {
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar16 = Js::OpCodeUtil::GetOpCodeName((*local_40)->m_opcode);
    Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s.\n"
                  ,pcVar14,pcVar15,pcVar16,local_1b8);
    Output::Flush();
  }
  pInstr_00 = local_40;
  ToTypeSpecUse(this,*local_40,(*local_40)->m_src1,this->currentBlock,src1Val,(IndirOpnd *)0x0,
                local_33,(BailOutKind)stack0xffffffffffffffa8,bVar6,(Instr *)0x0);
  BVar18 = local_38;
  if (this->prePassLoop != (Loop *)0x0) {
    return true;
  }
  if (((*pInstr_00)->m_opcode == StElemC) &&
     (bVar5 = ValueType::IsObject((ValueType *)&local_32[0].field_0), bVar5)) {
    bVar5 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    if (!bVar5) {
      return true;
    }
    local_1b8[0] = -0x80000000;
    baseValueTypeStr[0xf8] = -1;
    baseValueTypeStr[0xf9] = -1;
    baseValueTypeStr[0xfa] = -1;
    baseValueTypeStr[0xfb] = '\x7f';
    bVar5 = ValueInfo::GetIntValMinMax
                      (src1Val->valueInfo,local_1b8,(int *)(baseValueTypeStr + 0xf8),false);
    if (bVar5) {
      if (-0x7fffe < local_1b8[0]) {
        return true;
      }
      if ((int)baseValueTypeStr._248_4_ < -0x7fffe) {
        return true;
      }
    }
  }
  if (((*pInstr_00)->field_0x38 & 0x10) == 0) {
    GenerateBailAtOperation(this,pInstr_00,BVar18);
    return true;
  }
  BVar10 = IR::Instr::GetBailOutKind(*pInstr_00);
  if ((((BVar10 & ~BailOutKindBits) != BailOutOnImplicitCallsPreOp) &&
      ((BVar10 & ~BailOutKindBits) != BailOutInvalid)) ||
     ((BVar10 & (LazyBailOut|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                 BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                 BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                 BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                BailOutOnResultConditions)) != BailOutInvalid)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2bcf,
                       "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                       ,
                       "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                      );
    if (!bVar5) goto LAB_00461177;
    *puVar11 = 0;
  }
  if (BVar18 != BailOutConventionalNativeArrayAccessOnly) {
    if (BVar18 == BailOutConventionalTypedArrayAccessOnly) {
      this_01 = *pInstr_00;
      BVar10 = BVar10 & (BailOutMisc|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                         BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                         BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                         BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                        BailOutOnResultConditions) | BailOutConventionalTypedArrayAccessOnly;
      goto LAB_0046116a;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2bdc,"(arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)",
                       "arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
    if (!bVar5) {
LAB_00461177:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar11 = 0;
  }
  BVar10 = BVar10 | BVar18;
  this_01 = *pInstr_00;
LAB_0046116a:
  IR::Instr::SetBailOutKind(this_01,BVar10);
  return true;
}

Assistant:

bool
GlobOpt::TypeSpecializeStElem(IR::Instr ** pInstr, Value *src1Val, Value **pDstVal)
{
    IR::Instr *&instr = *pInstr;

    IR::RegOpnd *baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    ValueType baseValueType(baseOpnd->GetValueType());
    if (instr->DoStackArgsOpt() ||
        (!this->DoTypedArrayTypeSpec() && baseValueType.IsLikelyOptimizedTypedArray()) ||
        (!this->DoNativeArrayTypeSpec() && baseValueType.IsLikelyNativeArray()) ||
        !(baseValueType.IsLikelyOptimizedTypedArray() || baseValueType.IsLikelyNativeArray()))
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't type specialize array access, because typed array type specialization is disabled, or base is not an optimized typed array.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because %s.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr,
                instr->DoStackArgsOpt() ?
                    _u("instruction uses the arguments object") :
                    _u("typed array type specialization is disabled, or base is not an optimized typed array"));
            Output::Flush();
        }
        return false;
    }

    Assert(instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue()));

    StackSym *sym = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd()->m_sym : nullptr;

    // Only type specialize the source of store element if the source symbol is already type specialized to int or float.
    if (sym)
    {
        if (baseValueType.IsLikelyNativeArray())
        {
            // Gently coerce these src's into native if it seems likely to work.
            // Otherwise we can't use the fast path to store.
            // But don't try to put a float-specialized number into an int array this way.
            if (!(
                    CurrentBlockData()->IsInt32TypeSpecialized(sym) ||
                    (
                        src1Val &&
                        (
                            DoAggressiveIntTypeSpec()
                                ? src1Val->GetValueInfo()->IsLikelyInt()
                                : src1Val->GetValueInfo()->IsInt()
                        )
                    )
                ))
            {
                if (!(
                        CurrentBlockData()->IsFloat64TypeSpecialized(sym) ||
                        (src1Val && src1Val->GetValueInfo()->IsLikelyNumber())
                    ) ||
                    baseValueType.HasIntElements())
                {
                    return false;
                }
            }
        }
        else if (!CurrentBlockData()->IsInt32TypeSpecialized(sym) && !CurrentBlockData()->IsFloat64TypeSpecialized(sym))
        {
            GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because src is not type specialized.\n"));
            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because src is not specialized.\n"),
                              this->func->GetJITFunctionBody()->GetDisplayName(),
                              this->func->GetDebugNumberSet(debugStringBuffer),
                              Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                              baseValueTypeStr);
                Output::Flush();
            }

            return false;
        }
    }

    int32 src1IntConstantValue;
    if(baseValueType.IsLikelyNativeIntArray() && src1Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&src1IntConstantValue))
    {
        if(Js::SparseArraySegment<int32>::IsMissingItem(&src1IntConstantValue))
        {
            return false;
        }
    }

    // Note: doing ToVarUses to make sure we do get the int32 version of the index before trying to access its value in
    // ShouldExpectConventionalArrayIndexValue. Not sure why that never gave us a problem before.
    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();

    // Make sure we use the int32 version of the index operand symbol, if available.  Otherwise, ensure the var symbol is live (by
    // potentially inserting a ToVar).
    this->ToVarUses(instr, dst, /* isDst = */ true, nullptr);

    if (!ShouldExpectConventionalArrayIndexValue(dst))
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because index is negative or likely not int.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because index is negative or likely not int.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr);
            Output::Flush();
        }
        return false;
    }

    IRType          toType = TyVar;
    bool            isLossyAllowed = true;
    IR::BailOutKind arrayBailOutKind = IR::BailOutConventionalTypedArrayAccessOnly;

    switch(baseValueType.GetObjectType())
    {
    case ObjectType::Int8Array:
    case ObjectType::Uint8Array:
    case ObjectType::Int16Array:
    case ObjectType::Uint16Array:
    case ObjectType::Int32Array:
    case ObjectType::Int8VirtualArray:
    case ObjectType::Uint8VirtualArray:
    case ObjectType::Int16VirtualArray:
    case ObjectType::Uint16VirtualArray:
    case ObjectType::Int32VirtualArray:
    case ObjectType::Int8MixedArray:
    case ObjectType::Uint8MixedArray:
    case ObjectType::Int16MixedArray:
    case ObjectType::Uint16MixedArray:
    case ObjectType::Int32MixedArray:
    Int32Array:
        if (this->DoAggressiveIntTypeSpec() || this->DoFloatTypeSpec())
        {
            toType = TyInt32;
        }
        break;

    case ObjectType::Uint32Array:
    case ObjectType::Uint32VirtualArray:
    case ObjectType::Uint32MixedArray:
        // Uint32Arrays may store values that overflow int32.  If the value being stored comes from a symbol that's
        // already losslessly type specialized to int32, we'll use it.  Otherwise, if we only have a float64 specialized
        // value, we don't want to force bailout if it doesn't fit in int32.  Instead, we'll emit conversion in the
        // lowerer, and handle overflow, if necessary.
        if (!sym || CurrentBlockData()->IsInt32TypeSpecialized(sym))
        {
            toType = TyInt32;
        }
        else if (CurrentBlockData()->IsFloat64TypeSpecialized(sym))
        {
            toType = TyFloat64;
        }
        break;

    case ObjectType::Float32Array:
    case ObjectType::Float64Array:
    case ObjectType::Float32VirtualArray:
    case ObjectType::Float32MixedArray:
    case ObjectType::Float64VirtualArray:
    case ObjectType::Float64MixedArray:
    Float64Array:
    if (this->DoFloatTypeSpec())
    {
         toType = TyFloat64;
    }
    break;

    case ObjectType::Uint8ClampedArray:
    case ObjectType::Uint8ClampedVirtualArray:
    case ObjectType::Uint8ClampedMixedArray:
        // Uint8ClampedArray requires rounding (as opposed to truncation) of floating point values. If source symbol is
        // float type specialized, type specialize this instruction to float as well, and handle rounding in the
        // lowerer.
            if (!sym || CurrentBlockData()->IsInt32TypeSpecialized(sym))
            {
                toType = TyInt32;
                isLossyAllowed = false;
            }
            else if (CurrentBlockData()->IsFloat64TypeSpecialized(sym))
            {
                toType = TyFloat64;
            }
        break;

    default:
        Assert(baseValueType.IsLikelyNativeArray());
        isLossyAllowed = false;
        arrayBailOutKind = IR::BailOutConventionalNativeArrayAccessOnly;
        if(baseValueType.HasIntElements())
        {
            goto Int32Array;
        }
        Assert(baseValueType.HasFloatElements());
        goto Float64Array;
    }

    if (toType != TyVar)
    {
        GOPT_TRACE_INSTR(instr, _u("Type specialized array access.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr,
                toType == TyInt32 ? _u("int32") : _u("float64"));
            Output::Flush();
        }

        IR::BailOutKind bailOutKind = ((toType == TyInt32) ? IR::BailOutIntOnly : IR::BailOutNumberOnly);
        this->ToTypeSpecUse(instr, instr->GetSrc1(), this->currentBlock, src1Val, nullptr, toType, bailOutKind, /* lossy = */ isLossyAllowed);

        if (!this->IsLoopPrePass())
        {
            bool bConvertToBailoutInstr = true;
            // Definite StElemC doesn't need bailout, because it can't fail or cause conversion.
            if (instr->m_opcode == Js::OpCode::StElemC && baseValueType.IsObject())
            {
                if (baseValueType.HasIntElements())
                {
                    //Native int array requires a missing element check & bailout
                    int32 min = INT32_MIN;
                    int32 max = INT32_MAX;

                    if (src1Val->GetValueInfo()->GetIntValMinMax(&min, &max, false))
                    {
                        bConvertToBailoutInstr = ((min <= Js::JavascriptNativeIntArray::MissingItem) && (max >= Js::JavascriptNativeIntArray::MissingItem));
                    }
                }
                else
                {
                    bConvertToBailoutInstr = false;
                }
            }

            if (bConvertToBailoutInstr)
            {
                if(instr->HasBailOutInfo())
                {
                    const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                    Assert(
                        (
                            !(oldBailOutKind & ~IR::BailOutKindBits) ||
                            (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                        !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                    if(arrayBailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                    {
                        // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                        // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                        // bails out for the right reason.
                        instr->SetBailOutKind(
                            arrayBailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                    }
                    else
                    {
                        // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                        // calls to occur, so it must be merged in to eliminate generating the helper call.
                        Assert(arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                        instr->SetBailOutKind(oldBailOutKind | arrayBailOutKind);
                    }
                }
                else
                {
                    GenerateBailAtOperation(&instr, arrayBailOutKind);
                }
            }
        }
    }
    else
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because the source was not already specialized.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because of array type.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr);
            Output::Flush();
        }
    }

    return toType != TyVar;
}